

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  floatx80 fVar9;
  floatx80 fVar10;
  
  fVar9.low = b.low;
  uVar1 = a.low;
  uVar6 = a._0_8_;
  uVar7 = a._0_4_ & 0x7fff;
  uVar8 = b._0_4_ & 0x7fff;
  iVar3 = uVar7 - uVar8;
  if (iVar3 == 0 || uVar7 < uVar8) {
    if (-1 < iVar3) {
      if (uVar7 != 0x7fff) {
        uVar1 = fVar9.low + uVar1;
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
          uVar6 = 0;
          goto LAB_0046881e;
        }
        uVar6 = uVar1 >> 0x20;
        fVar9.low = uVar6;
        if (uVar6 == 0) {
          fVar9.low = uVar1;
        }
        uVar7 = (uint)fVar9.low << 0x10;
        if (fVar9.low >= 0x10000) {
          uVar7 = (uint)fVar9.low;
        }
        bVar5 = (fVar9.low < 0x10000) * '\x10';
        bVar2 = bVar5 + 8;
        uVar8 = uVar7 << 8;
        if (0xffffff < uVar7) {
          bVar2 = bVar5;
          uVar8 = uVar7;
        }
        bVar2 = (bVar2 | (uVar6 == 0) << 5) +
                countLeadingZeros32_countLeadingZerosHigh[uVar8 >> 0x18];
        uVar1 = uVar1 << (bVar2 & 0x3f);
        uVar7 = 1 - (int)(char)bVar2;
        uVar6 = 0;
        goto LAB_00468849;
      }
      lVar4 = (fVar9.low | uVar1) << 1;
      goto LAB_0046867f;
    }
    if (uVar8 != 0x7fff) {
      iVar3 = iVar3 + (uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      uVar7 = uVar8;
      if ((short)iVar3 == 0) {
        uVar6 = 0;
      }
      else if ((ushort)-iVar3 < 0x40) {
        uVar6 = uVar1 << ((byte)iVar3 & 0x3f);
        uVar1 = uVar1 >> ((byte)-iVar3 & 0x3f);
      }
      else if ((short)iVar3 == -0x40) {
        uVar6 = uVar1;
        uVar1 = 0;
      }
      else {
        uVar6 = (ulong)(uVar1 != 0);
        uVar1 = 0;
      }
      goto LAB_00468813;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      uVar6 = (ulong)((uint)(byte)zSign << 0xf | 0x7fff);
      uVar1 = 0x8000000000000000;
      goto LAB_00468861;
    }
LAB_00468688:
    fVar9._0_8_ = b._0_8_ & 0xffffffff;
    fVar9 = propagateFloatx80NaN(a,fVar9);
  }
  else {
    if (uVar7 == 0x7fff) {
      lVar4 = uVar1 * 2;
LAB_0046867f:
      if (lVar4 == 0) goto LAB_00468861;
      goto LAB_00468688;
    }
    uVar8 = iVar3 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0
                          );
    if (uVar8 == 0) {
      uVar6 = 0;
    }
    else if (uVar8 < 0x40) {
      uVar6 = fVar9.low << (-(byte)uVar8 & 0x3f);
      fVar9.low = fVar9.low >> ((byte)uVar8 & 0x3f);
    }
    else if (uVar8 == 0x40) {
      uVar6 = fVar9.low;
      fVar9.low = 0;
    }
    else {
      uVar6 = (ulong)(fVar9.low != 0);
      fVar9.low = 0;
    }
LAB_00468813:
    uVar1 = uVar1 + fVar9.low;
    if (-1 < (long)uVar1) {
LAB_0046881e:
      uVar6 = (ulong)(uVar6 != 0) | uVar1 << 0x3f;
      uVar1 = (uVar1 >> 1) + 0x8000000000000000;
      uVar7 = uVar7 + 1;
    }
LAB_00468849:
    fVar9 = roundAndPackFloatx80(floatx80_rounding_precision,zSign,uVar7,uVar1,uVar6);
  }
  uVar1 = fVar9.low;
  uVar6 = (ulong)fVar9._0_4_;
LAB_00468861:
  fVar10._0_8_ = uVar6 & 0xffffffff;
  fVar10.low = uVar1;
  return fVar10;
}

Assistant:

static floatx80 addFloatx80Sigs( floatx80 a, floatx80 b, flag zSign )
{
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	int32 expDiff;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	expDiff = aExp - bExp;
	if ( 0 < expDiff ) {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( aSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return a;
		}
		if ( bExp == 0 ) --expDiff;
		shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
		zExp = aExp;
	}
	else if ( expDiff < 0 ) {
		if ( bExp == 0x7FFF ) {
			if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
		}
		if ( aExp == 0 ) ++expDiff;
		shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
		zExp = bExp;
	}
	else {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( ( aSig | bSig )<<1 ) ) {
				return propagateFloatx80NaN( a, b );
			}
			return a;
		}
		zSig1 = 0;
		zSig0 = aSig + bSig;
		if ( aExp == 0 ) {
			normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
			goto roundAndPack;
		}
		zExp = aExp;
		goto shiftRight1;
	}
	zSig0 = aSig + bSig;
	if ( (sbits64) zSig0 < 0 ) goto roundAndPack;
	shiftRight1:
	shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
	zSig0 |= LIT64( 0x8000000000000000 );
	++zExp;
	roundAndPack:
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}